

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Options::Add<int>(Options *this,int *var,char flag,string *long_flag,string *description,
                 int default_val,string *group)

{
  mapped_type *this_00;
  reference_wrapper<int> local_108;
  Options *local_100;
  code *local_f8;
  undefined8 local_f0;
  type local_e8;
  string local_c8;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  option op;
  int default_val_local;
  string *description_local;
  string *long_flag_local;
  char flag_local;
  int *var_local;
  Options *this_local;
  
  op._28_4_ = default_val;
  std::__cxx11::string::string((string *)&local_78,long_flag);
  std::__cxx11::string::string((string *)&local_98,description);
  std::__cxx11::string::string((string *)&local_c8,group);
  add_entry<int&>(this,(option *)local_58,flag,&local_78,&local_98,&local_c8,true);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  op.name._0_4_ = 1;
  *var = op._28_4_;
  local_f8 = set<int>;
  local_f0 = 0;
  local_100 = this;
  local_108 = std::ref<int>(var);
  std::
  bind<void(Options::*)(int&,std::__cxx11::string),Options*,std::reference_wrapper<int>,std::_Placeholder<1>const&>
            (&local_e8,(offset_in_Options_to_subr *)&local_f8,&local_100,&local_108,
             (_Placeholder<1> *)&std::placeholders::_1);
  this_00 = std::
            map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::operator[](&this->setters,(key_type *)&op.flag);
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)this_00,&local_e8);
  std::vector<option,_std::allocator<option>_>::push_back(&this->options,(value_type *)local_58);
  return;
}

Assistant:

inline void Options::Add(T& var, char flag, std::string long_flag, std::string description, T default_val, std::string group) {
    struct option op;
    this->add_entry<T&>(op, flag, long_flag, description, group, true);

    op.has_arg = required_argument;
    var = default_val;

    this->setters[op.val] = std::bind(&Options::set<T>, this, std::ref(var), std::placeholders::_1);
    this->options.push_back(op);
}